

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

bool __thiscall QThreadPool::tryStart(QThreadPool *this,QRunnable *runnable)

{
  long lVar1;
  long in_RSI;
  long in_FS_OFFSET;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff98;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QThreadPoolPrivate *in_stack_ffffffffffffffc0;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    local_19 = false;
  }
  else {
    d_func((QThreadPool *)0x6cbfe6);
    QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_19 = QThreadPoolPrivate::tryStart
                         (in_stack_ffffffffffffffc0,
                          (QRunnable *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                         );
    QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPool::tryStart(QRunnable *runnable)
{
    if (!runnable)
        return false;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (d->tryStart(runnable))
        return true;

    return false;
}